

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void png_write_pCAL(png_structrp png_ptr,png_charp purpose,png_int_32 X0,png_int_32 X1,int type,
                   int nparams,png_const_charp units,png_charpp params)

{
  png_structrp png_ptr_00;
  png_uint_32 pVar1;
  size_t sVar2;
  png_voidp ptr;
  long lVar3;
  long lVar4;
  char *error_message;
  size_t sVar5;
  ulong uVar6;
  png_byte new_purpose [80];
  png_byte local_b2 [4];
  png_byte local_ae [4];
  undefined1 local_aa;
  undefined1 local_a9;
  ulong local_a8;
  size_t local_a0;
  ulong local_98;
  png_structrp local_90;
  png_byte local_88 [88];
  
  if (type < 4) {
    pVar1 = png_check_keyword(png_ptr,purpose,local_88);
    if (pVar1 != 0) {
      uVar6 = (ulong)(pVar1 + 1);
      sVar2 = strlen(units);
      sVar5 = (nparams != 0) + sVar2;
      local_90 = png_ptr;
      ptr = png_malloc(png_ptr,(long)nparams * 8);
      lVar4 = uVar6 + sVar5 + 10;
      pVar1 = (png_uint_32)lVar4;
      local_a8 = uVar6;
      local_a0 = sVar5;
      local_98 = (ulong)(uint)nparams;
      if (0 < nparams) {
        uVar6 = 0;
        do {
          sVar2 = strlen(params[uVar6]);
          lVar3 = (nparams - 1 != uVar6) + sVar2;
          *(long *)((long)ptr + uVar6 * 8) = lVar3;
          lVar4 = lVar4 + lVar3;
          pVar1 = (png_uint_32)lVar4;
          uVar6 = uVar6 + 1;
        } while ((uint)nparams != uVar6);
      }
      png_ptr_00 = local_90;
      png_write_chunk_header(local_90,0x7043414c,pVar1);
      png_write_chunk_data(png_ptr_00,local_88,local_a8);
      png_save_int_32(local_b2,X0);
      png_save_int_32(local_ae,X1);
      uVar6 = local_98;
      local_aa = (undefined1)type;
      local_a9 = (undefined1)local_98;
      png_write_chunk_data(png_ptr_00,local_b2,10);
      png_write_chunk_data(png_ptr_00,(png_const_bytep)units,local_a0);
      if (0 < (int)uVar6) {
        uVar6 = 0;
        do {
          png_write_chunk_data
                    (png_ptr_00,(png_const_bytep)params[uVar6],*(size_t *)((long)ptr + uVar6 * 8));
          uVar6 = uVar6 + 1;
        } while ((uint)nparams != uVar6);
      }
      png_free(png_ptr_00,ptr);
      png_write_chunk_end(png_ptr_00);
      return;
    }
    error_message = "pCAL: invalid keyword";
  }
  else {
    error_message = "Unrecognized equation type for pCAL chunk";
  }
  png_error(png_ptr,error_message);
}

Assistant:

void /* PRIVATE */
png_write_pCAL(png_structrp png_ptr, png_charp purpose, png_int_32 X0,
    png_int_32 X1, int type, int nparams, png_const_charp units,
    png_charpp params)
{
   png_uint_32 purpose_len;
   size_t units_len, total_len;
   png_size_tp params_len;
   png_byte buf[10];
   png_byte new_purpose[80];
   int i;

   png_debug1(1, "in png_write_pCAL (%d parameters)", nparams);

   if (type >= PNG_EQUATION_LAST)
      png_error(png_ptr, "Unrecognized equation type for pCAL chunk");

   purpose_len = png_check_keyword(png_ptr, purpose, new_purpose);

   if (purpose_len == 0)
      png_error(png_ptr, "pCAL: invalid keyword");

   ++purpose_len; /* terminator */

   png_debug1(3, "pCAL purpose length = %d", (int)purpose_len);
   units_len = strlen(units) + (nparams == 0 ? 0 : 1);
   png_debug1(3, "pCAL units length = %d", (int)units_len);
   total_len = purpose_len + units_len + 10;

   params_len = (png_size_tp)png_malloc(png_ptr,
       (png_alloc_size_t)((png_alloc_size_t)nparams * (sizeof (size_t))));

   /* Find the length of each parameter, making sure we don't count the
    * null terminator for the last parameter.
    */
   for (i = 0; i < nparams; i++)
   {
      params_len[i] = strlen(params[i]) + (i == nparams - 1 ? 0 : 1);
      png_debug2(3, "pCAL parameter %d length = %lu", i,
          (unsigned long)params_len[i]);
      total_len += params_len[i];
   }

   png_debug1(3, "pCAL total length = %d", (int)total_len);
   png_write_chunk_header(png_ptr, png_pCAL, (png_uint_32)total_len);
   png_write_chunk_data(png_ptr, new_purpose, purpose_len);
   png_save_int_32(buf, X0);
   png_save_int_32(buf + 4, X1);
   buf[8] = (png_byte)type;
   buf[9] = (png_byte)nparams;
   png_write_chunk_data(png_ptr, buf, 10);
   png_write_chunk_data(png_ptr, (png_const_bytep)units, (size_t)units_len);

   for (i = 0; i < nparams; i++)
   {
      png_write_chunk_data(png_ptr, (png_const_bytep)params[i], params_len[i]);
   }

   png_free(png_ptr, params_len);
   png_write_chunk_end(png_ptr);
}